

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_> *
__thiscall
pstd::
vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
operator=(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
          *this,vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  PiecewiseConstant1D *pPVar3;
  PiecewiseConstant1D *pPVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pPVar3 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pPVar3;
      sVar5 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar5;
      sVar5 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar5;
    }
    else {
      clear(this);
      reserve(this,other->nStored);
      if (other->nStored == 0) {
        uVar9 = 0;
      }
      else {
        lVar7 = 0x40;
        uVar8 = 0;
        do {
          pPVar3 = other->ptr;
          pPVar4 = this->ptr;
          uVar8 = uVar8 + 1;
          *(undefined8 *)((long)pPVar4 + lVar7 + -0x40) =
               *(undefined8 *)((long)pPVar3 + lVar7 + -0x40);
          puVar1 = (undefined8 *)((long)pPVar4 + lVar7 + -0x38);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pPVar4 + lVar7 + -0x28) = 0;
          puVar1 = (undefined8 *)((long)pPVar3 + lVar7 + -0x30);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar4 + lVar7 + -0x30);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined8 *)((long)pPVar4 + lVar7 + -0x38) =
               *(undefined8 *)((long)pPVar3 + lVar7 + -0x38);
          *(undefined8 *)((long)pPVar3 + lVar7 + -0x28) = 0;
          puVar1 = (undefined8 *)((long)pPVar3 + lVar7 + -0x38);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pPVar4 + lVar7 + -0x20) =
               *(undefined8 *)((long)pPVar3 + lVar7 + -0x20);
          *(undefined8 *)((long)pPVar4 + lVar7 + -8) = 0;
          puVar1 = (undefined8 *)((long)pPVar4 + lVar7 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pPVar3 + lVar7 + -0x10);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar4 + lVar7 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined8 *)((long)pPVar4 + lVar7 + -0x18) =
               *(undefined8 *)((long)pPVar3 + lVar7 + -0x18);
          *(undefined8 *)((long)pPVar3 + lVar7 + -8) = 0;
          puVar1 = (undefined8 *)((long)pPVar3 + lVar7 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(pPVar4->func).ptr + lVar7) =
               *(undefined4 *)((long)&(pPVar3->func).ptr + lVar7);
          *(undefined8 *)((long)&(pPVar4->func).alloc.memoryResource + lVar7) =
               *(undefined8 *)((long)&(pPVar3->func).alloc.memoryResource + lVar7);
          lVar7 = lVar7 + 0x50;
          uVar9 = other->nStored;
        } while (uVar8 < uVar9);
      }
      this->nStored = uVar9;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }